

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O2

void __thiscall baryonyx::context::context(context *this,int verbose_level)

{
  message_type mVar1;
  message_type mVar2;
  
  solver_parameters::solver_parameters(&this->parameters);
  (this->method)._M_dataplus._M_p = (pointer)&(this->method).field_2;
  (this->method)._M_string_length = 0;
  (this->method).field_2._M_local_buf[0] = '\0';
  mVar1 = debug;
  if ((uint)verbose_level < 7) {
    mVar1 = verbose_level;
  }
  mVar2 = emerg;
  if (-1 < verbose_level) {
    mVar2 = mVar1;
  }
  *(undefined8 *)&(this->start).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->start).super__Function_base._M_functor + 8) = 0;
  (this->start).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->start)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->update).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->update).super__Function_base._M_functor + 8) = 0;
  (this->update).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->update)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->update).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->update).super__Function_base._M_functor + 8) = 0;
  (this->update).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->update)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->finish).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->finish).super__Function_base._M_functor + 8) = 0;
  (this->finish).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->finish)._M_invoker = (_Invoker_type)0x0;
  this->log_priority = mVar2;
  return;
}

Assistant:

context(int verbose_level = 6)
      : log_priority(convert_verbose_level(verbose_level))
    {}